

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

SyntaxList<slang::syntax::CaseItemSyntax> * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::SyntaxList<slang::syntax::CaseItemSyntax>,slang::syntax::SyntaxList<slang::syntax::CaseItemSyntax>const&>
          (BumpAllocator *this,SyntaxList<slang::syntax::CaseItemSyntax> *args)

{
  SyntaxList<slang::syntax::CaseItemSyntax> *this_00;
  SyntaxList<slang::syntax::CaseItemSyntax> *args_local;
  BumpAllocator *this_local;
  
  this_00 = (SyntaxList<slang::syntax::CaseItemSyntax> *)allocate(this,0x30,8);
  slang::syntax::SyntaxList<slang::syntax::CaseItemSyntax>::SyntaxList(this_00,args);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }